

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIFT.cpp
# Opt level: O0

void findMatches(vector<extrema,_std::allocator<extrema>_> *ex1,
                vector<extrema,_std::allocator<extrema>_> *ex2,
                vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *matchKP1,
                vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *matchKP2,uint *cnt_match
                )

{
  double dVar1;
  bool bVar2;
  reference peVar3;
  reference peVar4;
  ulong uVar5;
  size_type sVar6;
  const_reference pvVar7;
  const_reference pvVar8;
  const_reference pvVar9;
  reference pvVar10;
  reference pvVar11;
  reference pvVar12;
  ostream *poVar13;
  __type _Var14;
  pair<double,_int> pVar15;
  value_type local_1ec;
  value_type local_1e4;
  int local_1dc;
  double dStack_1d8;
  int i_4;
  int local_1d0;
  double local_1c8;
  int local_1c0 [2];
  double local_1b8;
  int local_1b0;
  double local_1a8;
  int local_1a0;
  int local_194;
  undefined1 local_190 [4];
  int i_3;
  vector<int,_std::allocator<int>_> SecondMinIdx;
  int local_160 [2];
  double local_158;
  int local_150;
  double local_148;
  int local_140;
  int local_134;
  undefined1 local_130 [4];
  int i_2;
  vector<int,_std::allocator<int>_> MinIdx;
  vector<double,_std::allocator<double>_> everySecondMinDist;
  vector<double,_std::allocator<double>_> everyMinDist;
  int local_d8;
  int local_d4;
  int l_1;
  int k_1;
  double tmpSum;
  undefined1 local_c0 [4];
  int j_1;
  vector<double,_std::allocator<double>_> tmpEveryDist;
  undefined1 local_a0 [4];
  int i_1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  everyDist;
  int l;
  int k;
  double dist;
  extrema *j;
  const_iterator __end2;
  const_iterator __begin2;
  vector<extrema,_std::allocator<extrema>_> *__range2;
  extrema *i;
  const_iterator __end1;
  const_iterator __begin1;
  vector<extrema,_std::allocator<extrema>_> *__range1;
  double min_dist;
  uint *cnt_match_local;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *matchKP2_local;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *matchKP1_local;
  vector<extrema,_std::allocator<extrema>_> *ex2_local;
  vector<extrema,_std::allocator<extrema>_> *ex1_local;
  
  __range1 = (vector<extrema,_std::allocator<extrema>_> *)0x408f400000000000;
  __end1 = std::vector<extrema,_std::allocator<extrema>_>::begin(ex1);
  i = (extrema *)std::vector<extrema,_std::allocator<extrema>_>::end(ex1);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_extrema_*,_std::vector<extrema,_std::allocator<extrema>_>_>
                                *)&i);
    if (!bVar2) break;
    peVar3 = __gnu_cxx::
             __normal_iterator<const_extrema_*,_std::vector<extrema,_std::allocator<extrema>_>_>::
             operator*(&__end1);
    __end2 = std::vector<extrema,_std::allocator<extrema>_>::begin(ex2);
    j = (extrema *)std::vector<extrema,_std::allocator<extrema>_>::end(ex2);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_extrema_*,_std::vector<extrema,_std::allocator<extrema>_>_>
                                  *)&j);
      if (!bVar2) break;
      peVar4 = __gnu_cxx::
               __normal_iterator<const_extrema_*,_std::vector<extrema,_std::allocator<extrema>_>_>::
               operator*(&__end2);
      _l = (vector<extrema,_std::allocator<extrema>_> *)0x0;
      everyDist.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      while( true ) {
        uVar5 = (ulong)everyDist.
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        sVar6 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::size(&peVar4->NeighborCells);
        if (sVar6 <= uVar5) break;
        everyDist.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        while( true ) {
          uVar5 = (ulong)(int)everyDist.
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage;
          pvVar8 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&peVar4->NeighborCells,
                                (long)everyDist.
                                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          sVar6 = std::vector<double,_std::allocator<double>_>::size(pvVar8);
          if (sVar6 <= uVar5) break;
          pvVar8 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&peVar3->NeighborCells,
                                (long)everyDist.
                                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                             (pvVar8,(long)(int)everyDist.
                                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
          dVar1 = *pvVar9;
          pvVar8 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&peVar4->NeighborCells,
                                (long)everyDist.
                                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                             (pvVar8,(long)(int)everyDist.
                                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
          _Var14 = std::pow<double,int>(dVar1 - *pvVar9,2);
          _l = (vector<extrema,_std::allocator<extrema>_> *)(_Var14 + (double)_l);
          everyDist.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
               (int)everyDist.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 1;
        }
        everyDist.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             everyDist.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
      }
      if ((double)_l < (double)__range1) {
        __range1 = _l;
      }
      __gnu_cxx::__normal_iterator<const_extrema_*,_std::vector<extrema,_std::allocator<extrema>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::__normal_iterator<const_extrema_*,_std::vector<extrema,_std::allocator<extrema>_>_>::
    operator++(&__end1);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)local_a0);
  tmpEveryDist.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  while( true ) {
    uVar5 = (ulong)tmpEveryDist.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_;
    sVar6 = std::vector<extrema,_std::allocator<extrema>_>::size(ex1);
    if (sVar6 <= uVar5) break;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_c0);
    tmpSum._4_4_ = 0;
    while( true ) {
      uVar5 = (ulong)tmpSum._4_4_;
      sVar6 = std::vector<extrema,_std::allocator<extrema>_>::size(ex2);
      if (sVar6 <= uVar5) break;
      _l_1 = 0.0;
      local_d4 = 0;
      while( true ) {
        pvVar7 = std::vector<extrema,_std::allocator<extrema>_>::operator[](ex2,(long)tmpSum._4_4_);
        sVar6 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::size(&pvVar7->NeighborCells);
        if (sVar6 <= (ulong)(long)local_d4) break;
        local_d8 = 0;
        while( true ) {
          pvVar7 = std::vector<extrema,_std::allocator<extrema>_>::operator[]
                             (ex2,(long)tmpSum._4_4_);
          pvVar8 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&pvVar7->NeighborCells,(long)local_d4);
          sVar6 = std::vector<double,_std::allocator<double>_>::size(pvVar8);
          if (sVar6 <= (ulong)(long)local_d8) break;
          pvVar7 = std::vector<extrema,_std::allocator<extrema>_>::operator[]
                             (ex1,(long)tmpEveryDist.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage._4_4_);
          pvVar8 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&pvVar7->NeighborCells,(long)local_d4);
          pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](pvVar8,(long)local_d8);
          dVar1 = *pvVar9;
          pvVar7 = std::vector<extrema,_std::allocator<extrema>_>::operator[]
                             (ex2,(long)tmpSum._4_4_);
          pvVar8 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&pvVar7->NeighborCells,(long)local_d4);
          pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](pvVar8,(long)local_d8);
          _Var14 = std::pow<double,int>(dVar1 - *pvVar9,2);
          _l_1 = _Var14 + _l_1;
          local_d8 = local_d8 + 1;
        }
        local_d4 = local_d4 + 1;
      }
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)local_c0,(value_type_conflict1 *)&l_1);
      tmpSum._4_4_ = tmpSum._4_4_ + 1;
    }
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)local_a0,(value_type *)local_c0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_c0);
    tmpEveryDist.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage._4_4_ =
         tmpEveryDist.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
  }
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &everySecondMinDist.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &MinIdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_130);
  local_134 = 0;
  while( true ) {
    uVar5 = (ulong)local_134;
    sVar6 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)local_a0);
    if (sVar6 <= uVar5) break;
    pvVar10 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)local_a0,(long)local_134);
    pVar15 = Min(pvVar10);
    local_158 = pVar15.first;
    local_150 = pVar15.second;
    local_148 = local_158;
    local_140 = local_150;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               &everySecondMinDist.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_148);
    pvVar10 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)local_a0,(long)local_134);
    pVar15 = Min(pvVar10);
    SecondMinIdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)pVar15.first;
    local_160[0] = pVar15.second;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_130,local_160);
    local_134 = local_134 + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_190);
  local_194 = 0;
  while( true ) {
    uVar5 = (ulong)local_194;
    sVar6 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)local_a0);
    if (sVar6 <= uVar5) break;
    pvVar10 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)local_a0,(long)local_194);
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_130,(long)local_194);
    pVar15 = secondMin(pvVar10,pvVar11);
    local_1b8 = pVar15.first;
    local_1b0 = pVar15.second;
    local_1a8 = local_1b8;
    local_1a0 = local_1b0;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               &MinIdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage,&local_1a8);
    pvVar10 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)local_a0,(long)local_194);
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_130,(long)local_194);
    pVar15 = secondMin(pvVar10,pvVar11);
    dStack_1d8 = pVar15.first;
    local_1d0 = pVar15.second;
    local_1c8 = dStack_1d8;
    local_1c0[0] = local_1d0;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_190,local_1c0);
    local_194 = local_194 + 1;
  }
  local_1dc = 0;
  do {
    uVar5 = (ulong)local_1dc;
    sVar6 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)local_a0);
    if (sVar6 <= uVar5) {
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)local_190);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)local_130);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)
                 &MinIdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)
                 &everySecondMinDist.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)local_a0);
      return;
    }
    pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)
                         &everySecondMinDist.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_1dc);
    dVar1 = *pvVar12;
    pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)
                         &MinIdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,(long)local_1dc);
    if (dVar1 / *pvVar12 < 0.8) {
LAB_00112eff:
      poVar13 = std::operator<<((ostream *)&std::cout,"(");
      pvVar7 = std::vector<extrema,_std::allocator<extrema>_>::operator[](ex1,(long)local_1dc);
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,(pvVar7->pt).x);
      poVar13 = std::operator<<(poVar13,", ");
      pvVar7 = std::vector<extrema,_std::allocator<extrema>_>::operator[](ex1,(long)local_1dc);
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,(pvVar7->pt).y);
      poVar13 = std::operator<<(poVar13,") match (");
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)local_130,(long)local_1dc);
      pvVar7 = std::vector<extrema,_std::allocator<extrema>_>::operator[](ex2,(long)*pvVar11);
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,(pvVar7->pt).x);
      poVar13 = std::operator<<(poVar13,", ");
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)local_130,(long)local_1dc);
      pvVar7 = std::vector<extrema,_std::allocator<extrema>_>::operator[](ex2,(long)*pvVar11);
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,(pvVar7->pt).y);
      poVar13 = std::operator<<(poVar13,")");
      std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
      std::vector<extrema,_std::allocator<extrema>_>::operator[](ex1,(long)local_1dc);
      cv::Point_::operator_cast_to_Point_((Point_ *)&local_1e4);
      std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::push_back
                (matchKP1,&local_1e4);
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)local_130,(long)local_1dc);
      std::vector<extrema,_std::allocator<extrema>_>::operator[](ex2,(long)*pvVar11);
      cv::Point_::operator_cast_to_Point_((Point_ *)&local_1ec);
      std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::push_back
                (matchKP2,&local_1ec);
      *cnt_match = *cnt_match + 1;
    }
    else {
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)
                           &everySecondMinDist.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_1dc);
      if (*pvVar12 <= 1.0 && *pvVar12 != 1.0) goto LAB_00112eff;
    }
    local_1dc = local_1dc + 1;
  } while( true );
}

Assistant:

void findMatches(const vector<extrema>& ex1, const vector<extrema>& ex2, vector<Point>& matchKP1, vector<Point>& matchKP2, unsigned& cnt_match){
    double min_dist = 1000;
    for(const auto& i:ex1){
        for(const auto& j:ex2){
            double dist = 0;
            for(int k = 0; k < j.NeighborCells.size(); k++){
                for(int l = 0; l < j.NeighborCells[k].size(); l++){
                    dist += pow(i.NeighborCells[k][l] - j.NeighborCells[k][l], 2);
                }
            }
            if(dist < min_dist) min_dist = dist;
        }
    }

    vector<vector<double> > everyDist;
    for(int i = 0; i < ex1.size(); i++){
        vector<double> tmpEveryDist;
        for(int j = 0; j < ex2.size(); j++){
            double tmpSum = 0;
            for(int k = 0; k < ex2[j].NeighborCells.size(); k++){
                for(int l = 0; l < ex2[j].NeighborCells[k].size(); l++){
                    tmpSum += pow(ex1[i].NeighborCells[k][l] - ex2[j].NeighborCells[k][l], 2);
                }
            }
            tmpEveryDist.push_back(tmpSum);
        }
        everyDist.push_back(tmpEveryDist);
    }

    vector<double> everyMinDist, everySecondMinDist;
    vector<int> MinIdx;
    for(int i = 0; i < everyDist.size(); i++){
        everyMinDist.push_back(Min(everyDist[i]).first);
        MinIdx.push_back(Min(everyDist[i]).second);
    }
    vector<int> SecondMinIdx;
    for(int i = 0; i < everyDist.size(); i++){
        everySecondMinDist.push_back(secondMin(everyDist[i], MinIdx[i]).first);
        SecondMinIdx.push_back(secondMin(everyDist[i], MinIdx[i]).second);
    }
    for(int i = 0; i < everyDist.size(); i++){
        if(everyMinDist[i]/double(everySecondMinDist[i]) < match_ratio || everyMinDist[i] < 1 ){
            cout << "(" << ex1[i].pt.x << ", " << ex1[i].pt.y << ") match ("
                << ex2[MinIdx[i]].pt.x << ", " << ex2[MinIdx[i]].pt.y << ")" << endl;
            matchKP1.push_back(ex1[i].pt);
            matchKP2.push_back(ex2[MinIdx[i]].pt);
            cnt_match++;
        }
    }
}